

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O0

Storyboard * __thiscall
ApprovalTests::Storyboard::addDescription(Storyboard *this,string *description)

{
  ostream *poVar1;
  string *in_RSI;
  Storyboard *in_RDI;
  
  poVar1 = ::std::operator<<((ostream *)&in_RDI->field_0x10,in_RSI);
  ::std::operator<<(poVar1,"\n");
  in_RDI->addNewLineBeforeNextFrame_ = true;
  return in_RDI;
}

Assistant:

Storyboard& Storyboard::addDescription(const std::string& description)
    {
        output_ << description << "\n";
        addNewLineBeforeNextFrame_ = true;
        return *this;
    }